

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

NumberParseMatcher * __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::nextCodePointMatcher
          (CodePointMatcherWarehouse *this,UChar32 cp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  CodePointMatcher **__src;
  CodePointMatcher *pCVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  CodePointMatcher **__dest;
  int iVar8;
  undefined4 in_register_00000034;
  uint uVar9;
  CodePointMatcher *pCVar10;
  NumberParseMatcher local_40;
  UChar32 local_38;
  
  iVar5 = this->codePointCount;
  lVar6 = (long)iVar5;
  if (lVar6 < 5) {
    this->codePointCount = iVar5 + 1;
    pCVar10 = (this->codePoints)._M_elems + lVar6;
    (this->codePoints)._M_elems[lVar6].fCp = cp;
  }
  else {
    iVar8 = this->codePointNumBatches;
    if (iVar8 * 10 + 5 <= iVar5) {
      puVar7 = (undefined8 *)
               UMemory::operator_new__((UMemory *)0xa8,CONCAT44(in_register_00000034,cp));
      if (puVar7 == (undefined8 *)0x0) {
        pCVar10 = (CodePointMatcher *)0x0;
      }
      else {
        *puVar7 = 10;
        lVar6 = 8;
        do {
          *(undefined ***)((long)puVar7 + lVar6) = &PTR__NumberParseMatcher_003d8da0;
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0xa8);
        pCVar10 = (CodePointMatcher *)(puVar7 + 1);
      }
      uVar2 = this->codePointNumBatches;
      if (((this->codePointsOverflow).capacity <= (int)uVar2) && (0 < (int)uVar2)) {
        uVar1 = uVar2 * 2;
        __dest = (CodePointMatcher **)uprv_malloc_63((ulong)uVar1 << 3);
        if (__dest != (CodePointMatcher **)0x0) {
          uVar3 = (this->codePointsOverflow).capacity;
          uVar9 = uVar2;
          if ((int)uVar3 < (int)uVar2) {
            uVar9 = uVar3;
          }
          if (SBORROW4(uVar9,uVar1) == (int)(uVar9 + uVar2 * -2) < 0) {
            uVar9 = uVar1;
          }
          __src = (this->codePointsOverflow).ptr;
          memcpy(__dest,__src,(long)(int)uVar9 << 3);
          if ((this->codePointsOverflow).needToRelease != '\0') {
            uprv_free_63(__src);
          }
          (this->codePointsOverflow).ptr = __dest;
          (this->codePointsOverflow).capacity = uVar1;
          (this->codePointsOverflow).needToRelease = '\x01';
        }
      }
      iVar5 = this->codePointNumBatches;
      iVar8 = iVar5 + 1;
      this->codePointNumBatches = iVar8;
      (this->codePointsOverflow).ptr[iVar5] = pCVar10;
      iVar5 = this->codePointCount;
    }
    pCVar4 = (this->codePointsOverflow).ptr[(long)iVar8 + -1];
    this->codePointCount = iVar5 + 1;
    iVar5 = iVar5 + ((iVar5 + -5) / 10) * -10 + -5;
    pCVar10 = pCVar4 + iVar5;
    pCVar4[iVar5].fCp = cp;
  }
  local_40._vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003d8da0;
  local_38 = cp;
  NumberParseMatcher::~NumberParseMatcher(&local_40);
  return &pCVar10->super_NumberParseMatcher;
}

Assistant:

NumberParseMatcher& CodePointMatcherWarehouse::nextCodePointMatcher(UChar32 cp) {
    if (codePointCount < CODE_POINT_STACK_CAPACITY) {
        return codePoints[codePointCount++] = {cp};
    }
    int32_t totalCapacity = CODE_POINT_STACK_CAPACITY + codePointNumBatches * CODE_POINT_BATCH_SIZE;
    if (codePointCount >= totalCapacity) {
        // Need a new batch
        auto* nextBatch = new CodePointMatcher[CODE_POINT_BATCH_SIZE];
        if (codePointNumBatches >= codePointsOverflow.getCapacity()) {
            // Need more room for storing pointers to batches
            codePointsOverflow.resize(codePointNumBatches * 2, codePointNumBatches);
        }
        codePointsOverflow[codePointNumBatches++] = nextBatch;
    }
    return codePointsOverflow[codePointNumBatches - 1][(codePointCount++ - CODE_POINT_STACK_CAPACITY) %
                                                       CODE_POINT_BATCH_SIZE] = {cp};
}